

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O3

wchar_t borg_launch_bolt(wchar_t rad,wchar_t dam,wchar_t typ,wchar_t max,wchar_t ammo_location)

{
  byte bVar1;
  loc_conflict t;
  chunk_conflict *pcVar2;
  int x1;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  loc lVar7;
  loc_conflict lVar8;
  loc_conflict lVar9;
  ulong uVar10;
  undefined4 in_register_0000000c;
  _Bool *p_Var11;
  int iVar12;
  wchar_t x;
  wchar_t y2;
  borg_grid *pbVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  wchar_t local_e8;
  wchar_t local_d8;
  int local_c4;
  int local_c0;
  wchar_t local_bc;
  wchar_t local_b8;
  wchar_t local_b4;
  wchar_t local_b0;
  int local_ac;
  _Bool *local_a8;
  borg_grid *local_a0;
  long local_98;
  int local_90;
  int local_8c;
  wchar_t local_88;
  wchar_t local_84;
  long local_80;
  _Bool *local_78;
  wchar_t *local_70;
  _Bool *local_68;
  ulong local_60;
  int local_58;
  wchar_t local_54;
  ulong local_50;
  undefined8 local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = CONCAT44(in_register_0000000c,max);
  if (borg_temp_n < 1) {
    local_d8 = L'\xffffffff';
  }
  else {
    local_88 = (wchar_t)z_info->max_range;
    local_58 = max + L'\xffffffff';
    local_40 = ~(long)rad;
    local_38 = (ulong)(uint)(rad * 2);
    local_c4 = -1;
    lVar15 = 0;
    local_90 = 0;
    local_8c = 0;
    local_d8 = L'\xffffffff';
    local_b0 = dam;
    local_84 = ammo_location;
    do {
      local_c0 = -1;
      uVar10 = local_40;
      local_98 = lVar15;
      do {
        iVar19 = -1;
        lVar14 = lVar15;
        local_50 = uVar10;
        do {
          pcVar2 = cave;
          local_60 = (ulong)borg_temp_x[lVar14];
          lVar16 = (long)local_c0 + local_60;
          bVar1 = borg_temp_y[lVar14];
          borg_tp_other_n = 0;
          uVar17 = (uint)lVar16;
          y2 = (wchar_t)((long)iVar19 + (ulong)bVar1);
          lVar7 = (loc)loc(uVar17,y2);
          _Var3 = square_in_bounds(pcVar2,lVar7);
          lVar15 = lVar14;
          if (_Var3) {
            lVar8 = loc((uint)borg_temp_x[lVar14],(uint)borg_temp_y[lVar14]);
            lVar9.y = borg.c.y;
            lVar9.x = borg.c.x;
            wVar4 = distance(lVar9,lVar8);
            lVar15 = local_98;
            if (uVar17 == borg_temp_x[lVar14]) {
              if ((typ != L'-') || (y2 == (uint)borg_temp_y[local_98])) {
LAB_0020800b:
                local_54 = wVar4;
                lVar9 = loc(uVar17,y2);
                lVar8.y = borg.c.y;
                lVar8.x = borg.c.x;
                wVar5 = distance(lVar8,lVar9);
                wVar4 = w_x;
                if (wVar5 <= (wchar_t)local_48) {
                  if (((L'\x01' < rad) &&
                      (borg_grids[(long)iVar19 + (ulong)bVar1][lVar16].feat != '\0')) ||
                     ((y2 == (uint)borg_temp_y[lVar15] && (uVar17 == borg_temp_x[lVar15])))) {
                    local_80 = lVar16;
                    wVar6 = borg_panel_wid();
                    wVar5 = w_y;
                    local_a0 = (borg_grid *)CONCAT44(local_a0._4_4_,wVar4 / wVar6);
                    wVar4 = borg_panel_hgt();
                    iVar12 = borg.c.y;
                    x1 = borg.c.x;
                    pcVar2 = cave;
                    local_a8 = (_Bool *)CONCAT44(local_a8._4_4_,wVar5 / wVar4);
                    wVar4 = (wchar_t)local_80;
                    lVar7 = (loc)loc(wVar4,y2);
                    _Var3 = square_in_bounds_fully(pcVar2,lVar7);
                    lVar15 = local_98;
                    if (_Var3) {
                      local_bc = x1;
                      local_b8 = iVar12;
                      if ((int)(uint)borg_kills[borg_grids[y2][wVar4].kill].r_idx <
                          (int)(z_info->r_max - 1)) {
                        local_e8 = L'\0';
                        if (1 < (wchar_t)local_48) {
                          lVar15 = (long)(int)local_a0;
                          local_a0 = (borg_grid *)(borg_detect_wall[(int)local_a8] + lVar15);
                          local_68 = borg_detect_wall[(int)local_a8 + 1] + lVar15;
                          local_78 = borg_detect_wall[(int)local_a8 + 1] + lVar15 + 1;
                          local_70 = &r_info[borg_kills[borg_grids[y2][wVar4].kill].r_idx].light;
                          local_e8 = L'\0';
                          local_b4 = iVar12;
                          iVar12 = local_58;
                          local_a8 = borg_detect_wall[(int)local_a8] + lVar15 + 1;
                          do {
                            borg_inc_motion(&local_b8,&local_bc,local_b4,x1,y2,wVar4);
                            pcVar2 = cave;
                            lVar7 = (loc)loc(local_bc,local_b8);
                            _Var3 = square_in_bounds_fully(pcVar2,lVar7);
                            if (!_Var3) {
LAB_002084b1:
                              if (L'\0' < rad) {
                                local_b4 = y2 + rad;
                                if (y2 - rad < local_b4) {
                                  local_68 = (_Bool *)CONCAT44(local_68._4_4_,wVar4 - rad);
                                  local_70 = (wchar_t *)CONCAT44(local_70._4_4_,rad + wVar4);
                                  lVar15 = (long)(y2 - rad);
                                  local_78 = (_Bool *)(((local_60 & 0xffffffff) + local_50) * 0xc +
                                                      9);
                                  local_60 = (ulong)(uint)((int)local_60 + (int)local_50);
                                  local_ac = iVar19;
                                  do {
                                    if ((int)local_68 < (int)local_70) {
                                      uVar10 = local_60 & 0xffffffff;
                                      uVar18 = local_38 & 0xffffffff;
                                      p_Var11 = local_78;
                                      do {
                                        pcVar2 = cave;
                                        wVar5 = (wchar_t)uVar10;
                                        wVar4 = (wchar_t)lVar15;
                                        lVar7 = (loc)loc(wVar5,wVar4);
                                        _Var3 = square_in_bounds(pcVar2,lVar7);
                                        if (_Var3) {
                                          local_a0 = borg_grids[lVar15];
                                          x = (wchar_t)local_80;
                                          wVar6 = borg_distance(y2,x,wVar4,wVar5);
                                          iVar19 = local_ac;
                                          if (wVar6 <= rad) {
                                            local_a8 = (_Bool *)CONCAT44(local_a8._4_4_,wVar6);
                                            _Var3 = borg_los(y2,x,wVar4,wVar5);
                                            pbVar13 = local_a0;
                                            iVar19 = local_ac;
                                            if (_Var3) {
                                              iVar19 = (int)local_a8 + 1;
                                              if (rad == L'\n') {
                                                iVar19 = 1;
                                              }
                                              wVar4 = borg_launch_bolt_aux_hack
                                                                ((uint)p_Var11[(long)&local_a0->feat
                                                                              ],local_b0 / iVar19,
                                                                 typ,local_84);
                                              iVar19 = local_ac;
                                              local_e8 = local_e8 + wVar4;
                                              pbVar13 = (borg_grid *)
                                                        (ulong)(byte)(&pbVar13[-1].field_0xb)
                                                                     [(long)p_Var11];
                                              if ((pbVar13 != (borg_grid *)0x0) &&
                                                 (borg_takes[(long)pbVar13].kind !=
                                                  (object_kind *)0x0)) {
                                                wVar4 = borg_launch_destroy_stuff(pbVar13,typ);
                                                local_e8 = local_e8 - wVar4;
                                              }
                                            }
                                          }
                                        }
                                        p_Var11 = p_Var11 + 0xc;
                                        uVar10 = (ulong)(uint)(wVar5 + L'\x01');
                                        uVar17 = (int)uVar18 - 1;
                                        uVar18 = (ulong)uVar17;
                                      } while (uVar17 != 0);
                                    }
                                    lVar15 = lVar15 + 1;
                                  } while (local_b4 != (wchar_t)lVar15);
                                }
                              }
                              goto LAB_0020816f;
                            }
                            pbVar13 = borg_grids[local_b8] + local_bc;
                            _Var3 = borg_cave_floor_grid(pbVar13);
                            if ((!_Var3) || (pbVar13->feat == '\x18')) {
LAB_00208681:
                              if ((rad == L'\xffffffff') || (lVar15 = local_98, rad == L'\n'))
                              goto LAB_0020816f;
                              goto LAB_002086a4;
                            }
                            if (rad == L'\n' || rad < L'\x01') {
                              wVar5 = borg_launch_bolt_aux_hack
                                                ((uint)pbVar13->kill,local_b0,typ,local_84);
                              local_e8 = local_e8 + wVar5;
                            }
                            if ((rad != L'\xffffffff') && (rad != L'\n')) {
                              if ((local_bc == wVar4) && (local_b8 == y2)) goto LAB_002084b1;
                              if ((rad == L'\0') && (pbVar13->kill != '\0')) goto LAB_0020816f;
                            }
                            if (borg.trait[0x25] == 0) {
                              if ((borg.trait[0x34] < 1) && (*local_70 < L'\x01'))
                              goto LAB_002083ec;
                            }
                            else if ((local_a0->feat == '\0') &&
                                    ((((*local_a8 == false && (*local_68 == false)) &&
                                      (*local_78 == false)) &&
                                     ((int)(uint)borg_fear_region[borg.c.y / 0xb][borg.c.x / 0xb] <
                                      (int)avoidance / 0x14)))) {
LAB_002083ec:
                              if (pbVar13->feat == '\0') goto LAB_00208681;
                            }
                            if (successful_target < L'\0') {
                              if ((uint)successful_target < 0xfffffff5) {
                                successful_target = L'\0';
                              }
                              goto LAB_00208681;
                            }
                            iVar12 = iVar12 + -1;
                          } while (iVar12 != 0);
                        }
                        if (L'\0' < rad) {
                          local_e8 = L'\0';
                        }
LAB_0020816f:
                        lVar15 = local_98;
                        if ((typ == L'-') && (L'\0' < local_e8)) {
                          local_e8 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
                          local_e8 = local_b0 - local_e8;
                        }
                        borg_tp_other_n = 0;
                        if (((((L'\0' < local_e8) && (y2 != L'A')) && ((int)local_80 != 0xc5)) &&
                            ((((int)local_80 != 0 && (y2 != L'\0')) &&
                             ((local_c4 < 0 || (local_d8 <= local_e8)))))) &&
                           ((local_e8 != local_d8 || (local_54 <= local_88)))) {
                          local_90 = local_c0;
                          local_c4 = (int)lVar15;
                          local_d8 = local_e8;
                          local_8c = iVar19;
                          local_88 = local_54;
                        }
                        goto LAB_00207fe8;
                      }
                    }
                  }
LAB_002086a4:
                  borg_tp_other_n = 0;
                }
              }
            }
            else if (typ != L'-') goto LAB_0020800b;
          }
LAB_00207fe8:
          iVar19 = iVar19 + 1;
          lVar14 = lVar15;
        } while (iVar19 != 2);
        local_c0 = local_c0 + 1;
        uVar10 = local_50 + 1;
      } while (local_c0 != 2);
      lVar15 = lVar15 + 1;
    } while (lVar15 < borg_temp_n);
    if ((local_c4 != -1) && (borg_tp_other_n = 0, borg_simulate == false)) {
      borg.goal.g.x = local_90 + (uint)borg_temp_x[local_c4];
      borg.goal.g.y = local_8c + (uint)borg_temp_y[local_c4];
      t.y = borg.goal.g.y;
      t.x = borg.goal.g.x;
      borg_target(t);
    }
  }
  return local_d8;
}

Assistant:

int borg_launch_bolt(int rad, int dam, int typ, int max, int ammo_location)
{
    int i     = 0;
    int b_i   = -1;
    int n     = 0;
    int b_n   = -1;
    int b_o_y = 0, b_o_x = 0;
    int o_y = 0, o_x = 0;
    int d, b_d       = z_info->max_range;

    /* Examine possible destinations */

    /* This will allow the borg to target places adjacent to a monster
     * in order to exploit and abuse a feature of the game.  Whereas,
     * the borg, while targeting a monster will not score d/t walls, he
     * could land a successful hit by targeting adjacent to the monster.
     * For example:
     * ######################
     * #####....@......######
     * ############Px........
     * ######################
     * In order to hit the P, the borg must target the x and not the P.
     *
     */
    for (i = 0; i < borg_temp_n; i++) {
        int x = borg_temp_x[i];
        int y = borg_temp_y[i];

        /* Consider each adjacent spot to and on top of the monster */
        for (o_x = -1; o_x <= 1; o_x++) {
            for (o_y = -1; o_y <= 1; o_y++) {
                /* Acquire location */
                x = borg_temp_x[i] + o_x;
                y = borg_temp_y[i] + o_y;

                /* Reset Teleport Other variables */
                borg_tp_other_n = 0;
                n               = 0;

                /* Bounds check */
                if (!square_in_bounds(cave, loc(x, y)))
                    continue;

                /* Remember how far away the monster is */
                d = distance(borg.c, loc(borg_temp_x[i], borg_temp_y[i]));

                /* Skip certain types of Offset attacks */
                if ((x != borg_temp_x[i] || y != borg_temp_y[i])
                    && typ == BORG_ATTACK_AWAY_ALL)
                    continue;

                /* Skip places that are out of range */
                if (distance(borg.c, loc(x, y)) > max)
                    continue;

                /* Consider it if its a ball spell or right on top of it */
                if ((rad >= 2 && borg_grids[y][x].feat != FEAT_NONE)
                    || (y == borg_temp_y[i] && x == borg_temp_x[i]))
                    n = borg_launch_bolt_at_location(
                        y, x, rad, dam, typ, max, ammo_location);

                /* Teleport Other is now considered */
                if (typ == BORG_ATTACK_AWAY_ALL && n > 0) {
                    /* Consider danger with certain monsters removed
                     * from the danger check.  They were removed from the list
                     * of considered monsters (borg_tp_other array)
                     */
                    n = borg_danger(borg.c.y, borg.c.x, 1, true, false);

                    /* since this is the danger after monster removal */
                    /* and dam for tel away is the previous danger */
                    /* we want the biggest reduction in danger */
                    n = dam - n;
                }

                /* Reset Teleport Other variables */
                borg_tp_other_n = 0;

                /* Skip useless attacks */
                if (n <= 0)
                    continue;

                /* The game forbids targetting the outside walls */
                if (x == 0 || y == 0 || x == DUNGEON_WID - 1
                    || y == DUNGEON_HGT - 1)
                    continue;

                /* Collect best attack */
                if ((b_i >= 0) && (n < b_n))
                    continue;

                /* Skip attacking farther monster if rewards are equal. */
                if (n == b_n && d > b_d)
                    continue;

                /* Track it */
                b_i   = i;
                b_n   = n;
                b_o_y = o_y;
                b_o_x = o_x;
                b_d   = d;
            }
        }
    }
    if (b_i == -1)
        return b_n;

    /* Reset Teleport Other variables */
    borg_tp_other_n = 0;

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Save the location */
    borg.goal.g.x = borg_temp_x[b_i] + b_o_x;
    borg.goal.g.y = borg_temp_y[b_i] + b_o_y;

    /* Target the location */
    (void)borg_target(borg.goal.g);

    /* Result */
    return b_n;
}